

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

void jsonReturnFromBlob(JsonParse *pParse,u32 i,sqlite3_context *pCtx,int textOnly)

{
  u8 *puVar1;
  u32 uVar2;
  int iVar3;
  u32 uVar4;
  char *pcVar5;
  byte bVar6;
  u8 uVar7;
  uint uVar8;
  uint uVar9;
  Mem *pMVar10;
  uint uVar11;
  i64 val;
  sqlite3_context *val_00;
  code *xDel;
  size_t sVar12;
  uint uVar13;
  ulong uVar14;
  ulong uVar15;
  double r;
  sqlite3_int64 iRes;
  uint local_12c;
  sqlite3_context *local_128;
  sqlite3 *local_120;
  uint local_114;
  ulong local_110;
  double local_108;
  JsonString local_100;
  JsonParse local_78;
  
  pMVar10 = pCtx->pOut;
  local_120 = pMVar10->db;
  uVar2 = jsonbPayloadSize(pParse,i,&local_12c);
  if (uVar2 == 0) {
    pCtx->isError = 1;
    goto LAB_001ac747;
  }
  puVar1 = pParse->aBlob;
  local_128 = pCtx;
  switch(puVar1[i] & 0xf) {
  case 0:
    if (local_12c == 0) {
      if ((pMVar10->flags & 0x9000) == 0) {
        pMVar10->flags = 1;
        return;
      }
      vdbeMemClearExternAndSetNull(pMVar10);
      return;
    }
    break;
  case 1:
    if (local_12c == 0) {
      if ((pMVar10->flags & 0x9000) != 0) {
        val = 1;
LAB_001ac9be:
        vdbeReleaseAndSetInt64(pMVar10,val);
        return;
      }
      (pMVar10->u).r = 4.94065645841247e-324;
LAB_001aca41:
      pMVar10->flags = 4;
      return;
    }
    break;
  case 2:
    if (local_12c == 0) {
      if ((pMVar10->flags & 0x9000) != 0) {
        val = 0;
        goto LAB_001ac9be;
      }
      (pMVar10->u).r = 0.0;
      goto LAB_001aca41;
    }
    break;
  case 3:
  case 4:
    local_100.pCtx = (sqlite3_context *)0x0;
    if (local_12c != 0) {
      uVar7 = puVar1[uVar2 + i];
      uVar14 = (ulong)(uVar2 + i);
      if (uVar7 == '-') {
        if (local_12c == 1) break;
        local_12c = local_12c - 1;
        iVar3 = uVar2 + i;
        uVar2 = uVar2 + 1;
        uVar14 = (ulong)(iVar3 + 1);
      }
      local_110 = uVar14;
      sVar12 = (size_t)(int)local_12c;
      local_114 = local_12c;
      pcVar5 = (char *)sqlite3DbMallocRawNN(local_120,sVar12 + 1);
      if (pcVar5 == (char *)0x0) goto LAB_001ac943;
      memcpy(pcVar5,puVar1 + local_110,sVar12);
      pcVar5[sVar12] = '\0';
      iVar3 = sqlite3DecOrHexToI64(pcVar5,(i64 *)&local_100);
      sqlite3DbFreeNN(local_120,pcVar5);
      if (iVar3 == 0) {
        val_00 = (sqlite3_context *)-(long)local_100.pCtx;
        if (uVar7 != '-') {
          val_00 = local_100.pCtx;
        }
LAB_001ac9ed:
        pMVar10 = local_128->pOut;
        if ((pMVar10->flags & 0x9000) != 0) {
          vdbeReleaseAndSetInt64(pMVar10,(i64)val_00);
          return;
        }
        (pMVar10->u).i = (i64)val_00;
        pMVar10->flags = 4;
        return;
      }
      if ((uVar7 == '-') && (iVar3 == 3)) {
        val_00 = (sqlite3_context *)0x8000000000000000;
        goto LAB_001ac9ed;
      }
      if ((uVar7 == '-') && (iVar3 != 1)) {
        uVar2 = uVar2 - 1;
        local_12c = local_114 + 1;
      }
      else {
        local_12c = local_114;
        if (iVar3 == 1) {
          pMVar10 = local_128->pOut;
          break;
        }
      }
LAB_001ac56e:
      puVar1 = pParse->aBlob;
      if (puVar1 == (u8 *)0x0) {
LAB_001ac943:
        sqlite3_result_error_nomem(local_128);
        return;
      }
      sVar12 = (size_t)(int)local_12c;
      pcVar5 = (char *)sqlite3DbMallocRawNN(local_120,sVar12 + 1);
      if (pcVar5 == (char *)0x0) goto LAB_001ac943;
      memcpy(pcVar5,puVar1 + (uVar2 + i),sVar12);
      pcVar5[sVar12] = '\0';
      sVar12 = strlen(pcVar5);
      iVar3 = sqlite3AtoF(pcVar5,&local_108,(uint)sVar12 & 0x3fffffff,'\x01');
      sqlite3DbFreeNN(local_120,pcVar5);
      pMVar10 = local_128->pOut;
      if (0 < iVar3) {
        sqlite3VdbeMemSetDouble(pMVar10,local_108);
        return;
      }
    }
    break;
  case 5:
  case 6:
    if (local_12c != 0) goto LAB_001ac56e;
    break;
  case 7:
  case 10:
    local_78.aBlob = puVar1 + (uVar2 + i);
    uVar7 = '\x01';
    goto LAB_001ac6c0;
  case 8:
  case 9:
    if (local_120 == (sqlite3 *)0x0) {
      local_78.aBlob = (u8 *)sqlite3Malloc((ulong)(local_12c + 1));
    }
    else {
      local_78.aBlob = (u8 *)sqlite3DbMallocRawNN(local_120,(ulong)(local_12c + 1));
    }
    if (local_78.aBlob != (u8 *)0x0) {
      if (local_12c == 0) {
        uVar14 = 0;
      }
      else {
        uVar11 = 0;
        uVar15 = 0;
        do {
          uVar13 = (uint)uVar15;
          if (puVar1[(ulong)uVar11 + (ulong)(uVar2 + i)] == '\\') {
            uVar4 = jsonUnescapeOneChar((char *)(puVar1 + (ulong)uVar11 + (ulong)(uVar2 + i)),
                                        local_12c - uVar11,(u32 *)&local_100);
            if ((uint)local_100.pCtx < 0x80) {
              iVar3 = 1;
              uVar9 = uVar13;
              uVar8 = (uint)local_100.pCtx;
LAB_001ac89b:
              uVar15 = (ulong)(uVar13 + iVar3);
              local_78.aBlob[uVar9] = (u8)uVar8;
            }
            else {
              bVar6 = (byte)local_100.pCtx;
              if ((uint)local_100.pCtx < 0x800) {
                uVar9 = uVar13 + 1;
                local_78.aBlob[uVar15] = (byte)((uint)local_100.pCtx >> 6) | 0xc0;
                uVar8 = (uint)(bVar6 & 0x3f | 0x80);
                iVar3 = 2;
                goto LAB_001ac89b;
              }
              if ((uint)local_100.pCtx < 0x10000) {
                local_78.aBlob[uVar15] = (byte)((uint)local_100.pCtx >> 0xc) | 0xe0;
                uVar9 = uVar13 + 2;
                local_78.aBlob[uVar13 + 1] = (byte)((uint)local_100.pCtx >> 6) & 0x3f | 0x80;
                uVar8 = (uint)(bVar6 & 0x3f | 0x80);
                iVar3 = 3;
                goto LAB_001ac89b;
              }
              if ((uint)local_100.pCtx != 0x99999) {
                local_78.aBlob[uVar15] = (byte)((uint)local_100.pCtx >> 0x12) | 0xf0;
                local_78.aBlob[uVar13 + 1] = (byte)((uint)local_100.pCtx >> 0xc) & 0x3f | 0x80;
                uVar9 = uVar13 + 3;
                local_78.aBlob[uVar13 + 2] = (byte)((uint)local_100.pCtx >> 6) & 0x3f | 0x80;
                uVar8 = (uint)(bVar6 & 0x3f | 0x80);
                iVar3 = 4;
                goto LAB_001ac89b;
              }
            }
            uVar11 = (uVar11 + uVar4) - 1;
            uVar14 = uVar15;
          }
          else {
            uVar14 = (ulong)(uVar13 + 1);
            local_78.aBlob[uVar15] = puVar1[(ulong)uVar11 + (ulong)(uVar2 + i)];
          }
          uVar11 = uVar11 + 1;
          uVar15 = uVar14;
        } while (uVar11 < local_12c);
      }
      local_12c = (uint)uVar14;
      local_78.aBlob[uVar14] = '\0';
      xDel = sqlite3OomClear;
      uVar7 = '\x01';
      goto LAB_001ac980;
    }
    goto LAB_001ac943;
  case 0xb:
  case 0xc:
    local_78.aBlob = puVar1 + i;
    if ((textOnly != 0) || (((ulong)pCtx->pFunc->pUserData & 8) == 0)) {
      local_78.zJson = (char *)0x0;
      local_78.db = (sqlite3 *)0x0;
      local_78.nJson = 0;
      local_78.nJPRef = 0;
      local_78.iErr = 0;
      local_78.iDepth = 0;
      local_78.nErr = '\0';
      local_78.oom = '\0';
      local_78.bJsonIsRCStr = '\0';
      local_78.hasNonstd = '\0';
      local_78.bReadOnly = '\0';
      local_78.eEdit = '\0';
      local_78.delta = 0;
      local_78.nIns = 0;
      local_78.iLabel = 0;
      local_78.aIns = (u8 *)0x0;
      local_78.nBlobAlloc = 0;
      local_78.nBlob = local_12c + uVar2;
      local_100.zBuf = local_100.zSpace;
      local_100.nAlloc = 100;
      local_100.nUsed = 0;
      local_100.bStatic = '\x01';
      local_100.eErr = '\0';
      local_100.pCtx = pCtx;
      jsonTranslateBlobToText(&local_78,0,&local_100);
      jsonReturnString(&local_100,(JsonParse *)0x0,(sqlite3_context *)0x0);
      return;
    }
    local_12c = local_12c + uVar2;
    uVar7 = '\0';
LAB_001ac6c0:
    xDel = (_func_void_void_ptr *)0xffffffffffffffff;
LAB_001ac980:
    setResultStrOrError(local_128,(char *)local_78.aBlob,local_12c,uVar7,xDel);
    return;
  }
  local_128->isError = 1;
LAB_001ac747:
  sqlite3VdbeMemSetStr(pMVar10,"malformed JSON",-1,'\x01',(_func_void_void_ptr *)0xffffffffffffffff)
  ;
  return;
}

Assistant:

static void jsonReturnFromBlob(
  JsonParse *pParse,          /* Complete JSON parse tree */
  u32 i,                      /* Index of the node */
  sqlite3_context *pCtx,      /* Return value for this function */
  int textOnly                /* return text JSON.  Disregard user-data */
){
  u32 n, sz;
  int rc;
  sqlite3 *db = sqlite3_context_db_handle(pCtx);

  n = jsonbPayloadSize(pParse, i, &sz);
  if( n==0 ){
    sqlite3_result_error(pCtx, "malformed JSON", -1);
    return;
  }
  switch( pParse->aBlob[i] & 0x0f ){
    case JSONB_NULL: {
      if( sz ) goto returnfromblob_malformed;
      sqlite3_result_null(pCtx);
      break;
    }
    case JSONB_TRUE: {
      if( sz ) goto returnfromblob_malformed;
      sqlite3_result_int(pCtx, 1);
      break;
    }
    case JSONB_FALSE: {
      if( sz ) goto returnfromblob_malformed;
      sqlite3_result_int(pCtx, 0);
      break;
    }
    case JSONB_INT5:
    case JSONB_INT: {
      sqlite3_int64 iRes = 0;
      char *z;
      int bNeg = 0;
      char x;
      if( sz==0 ) goto returnfromblob_malformed;
      x = (char)pParse->aBlob[i+n];
      if( x=='-' ){
        if( sz<2 ) goto returnfromblob_malformed;
        n++;
        sz--;
        bNeg = 1;
      }
      z = sqlite3DbStrNDup(db, (const char*)&pParse->aBlob[i+n], (int)sz);
      if( z==0 ) goto returnfromblob_oom;
      rc = sqlite3DecOrHexToI64(z, &iRes);
      sqlite3DbFree(db, z);
      if( rc==0 ){
        sqlite3_result_int64(pCtx, bNeg ? -iRes : iRes);
      }else if( rc==3 && bNeg ){
        sqlite3_result_int64(pCtx, SMALLEST_INT64);
      }else if( rc==1 ){
        goto returnfromblob_malformed;
      }else{
        if( bNeg ){ n--; sz++; }
        goto to_double;
      }
      break;
    }
    case JSONB_FLOAT5:
    case JSONB_FLOAT: {
      double r;
      char *z;
      if( sz==0 ) goto returnfromblob_malformed;
    to_double:
      z = sqlite3DbStrNDup(db, (const char*)&pParse->aBlob[i+n], (int)sz);
      if( z==0 ) goto returnfromblob_oom;
      rc = sqlite3AtoF(z, &r, sqlite3Strlen30(z), SQLITE_UTF8);
      sqlite3DbFree(db, z);
      if( rc<=0 ) goto returnfromblob_malformed;
      sqlite3_result_double(pCtx, r);
      break;
    }
    case JSONB_TEXTRAW:
    case JSONB_TEXT: {
      sqlite3_result_text(pCtx, (char*)&pParse->aBlob[i+n], sz,
                          SQLITE_TRANSIENT);
      break;
    }
    case JSONB_TEXT5:
    case JSONB_TEXTJ: {
      /* Translate JSON formatted string into raw text */
      u32 iIn, iOut;
      const char *z;
      char *zOut;
      u32 nOut = sz;
      z = (const char*)&pParse->aBlob[i+n];
      zOut = sqlite3DbMallocRaw(db, nOut+1);
      if( zOut==0 ) goto returnfromblob_oom;
      for(iIn=iOut=0; iIn<sz; iIn++){
        char c = z[iIn];
        if( c=='\\' ){
          u32 v;
          u32 szEscape = jsonUnescapeOneChar(&z[iIn], sz-iIn, &v);
          if( v<=0x7f ){
            zOut[iOut++] = (char)v;
          }else if( v<=0x7ff ){
            assert( szEscape>=2 );
            zOut[iOut++] = (char)(0xc0 | (v>>6));
            zOut[iOut++] = 0x80 | (v&0x3f);
          }else if( v<0x10000 ){
            assert( szEscape>=3 );
            zOut[iOut++] = 0xe0 | (v>>12);
            zOut[iOut++] = 0x80 | ((v>>6)&0x3f);
            zOut[iOut++] = 0x80 | (v&0x3f);
          }else if( v==JSON_INVALID_CHAR ){
            /* Silently ignore illegal unicode */
          }else{
            assert( szEscape>=4 );
            zOut[iOut++] = 0xf0 | (v>>18);
            zOut[iOut++] = 0x80 | ((v>>12)&0x3f);
            zOut[iOut++] = 0x80 | ((v>>6)&0x3f);
            zOut[iOut++] = 0x80 | (v&0x3f);
          }
          iIn += szEscape - 1;
        }else{
          zOut[iOut++] = c;
        }
      } /* end for() */
      assert( iOut<=nOut );
      zOut[iOut] = 0;
      sqlite3_result_text(pCtx, zOut, iOut, SQLITE_DYNAMIC);
      break;
    }
    case JSONB_ARRAY:
    case JSONB_OBJECT: {
      int flags = textOnly ? 0 : SQLITE_PTR_TO_INT(sqlite3_user_data(pCtx));
      if( flags & JSON_BLOB ){
        sqlite3_result_blob(pCtx, &pParse->aBlob[i], sz+n, SQLITE_TRANSIENT);
      }else{
        jsonReturnTextJsonFromBlob(pCtx, &pParse->aBlob[i], sz+n);
      }
      break;
    }
    default: {
      goto returnfromblob_malformed;
    }
  }
  return;

returnfromblob_oom:
  sqlite3_result_error_nomem(pCtx);
  return;

returnfromblob_malformed:
  sqlite3_result_error(pCtx, "malformed JSON", -1);
  return;
}